

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O2

bool __thiscall SecureDataManager::setSOPIN(SecureDataManager *this,ByteString *soPIN)

{
  ByteString *this_00;
  bool bVar1;
  size_t sVar2;
  int lineNo;
  char *format;
  ByteString key;
  
  sVar2 = ByteString::size(soPIN);
  if (sVar2 == 0) {
    format = "Zero length PIN specified";
    lineNo = 0xc4;
  }
  else {
    this_00 = &this->soEncryptedKey;
    sVar2 = ByteString::size(this_00);
    if ((sVar2 == 0) || (this->soLoggedIn != false)) {
      sVar2 = ByteString::size(this_00);
      if (sVar2 == 0) {
        ByteString::ByteString(&key);
        (*this->rng->_vptr_RNG[2])(this->rng,&key,0x20);
        remask(this,&key);
        ByteString::~ByteString(&key);
      }
      bVar1 = pbeEncryptKey(this,soPIN,this_00);
      return bVar1;
    }
    format = "SO must be logged in to change the SO PIN";
    lineNo = 0xcc;
  }
  softHSMLog(7,"setSOPIN",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureDataManager.cpp"
             ,lineNo,format);
  return false;
}

Assistant:

bool SecureDataManager::setSOPIN(const ByteString& soPIN)
{
	// Check the new PIN
	if (soPIN.size() == 0)
	{
		DEBUG_MSG("Zero length PIN specified");

		return false;
	}

	// Check if the SO needs to be logged in
	if ((soEncryptedKey.size() > 0) && !soLoggedIn)
	{
		DEBUG_MSG("SO must be logged in to change the SO PIN");

		return false;
	}

	// If no SO PIN was set, then this is a SecureDataManager for a blank token. This
	// means a new key has to be generated
	if (soEncryptedKey.size() == 0)
	{
		ByteString key;

		rng->generateRandom(key, 32);

		remask(key);
	}

	return pbeEncryptKey(soPIN, soEncryptedKey);
}